

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O0

void * stbi__load_main(stbi__context *s,int *x,int *y,int *comp,int req_comp,stbi__result_info *ri,
                      int bpc)

{
  int iVar1;
  float *data;
  int local_5c;
  float *hdr;
  stbi__result_info *ri_local;
  int req_comp_local;
  int *comp_local;
  int *y_local;
  int *x_local;
  stbi__context *s_local;
  
  memset(ri,0,0xc);
  ri->bits_per_channel = 8;
  ri->channel_order = 0;
  ri->num_channels = 0;
  iVar1 = stbi__png_test(s);
  if (iVar1 == 0) {
    iVar1 = stbi__bmp_test(s);
    if (iVar1 == 0) {
      iVar1 = stbi__gif_test(s);
      if (iVar1 == 0) {
        iVar1 = stbi__psd_test(s);
        if (iVar1 == 0) {
          iVar1 = stbi__pic_test(s);
          if (iVar1 == 0) {
            iVar1 = stbi__jpeg_test(s);
            if (iVar1 == 0) {
              iVar1 = stbi__pnm_test(s);
              if (iVar1 == 0) {
                iVar1 = stbi__hdr_test(s);
                if (iVar1 == 0) {
                  iVar1 = stbi__tga_test(s);
                  if (iVar1 == 0) {
                    stbi__err("unknown image type");
                    s_local = (stbi__context *)0x0;
                  }
                  else {
                    s_local = (stbi__context *)stbi__tga_load(s,x,y,comp,req_comp,ri);
                  }
                }
                else {
                  data = stbi__hdr_load(s,x,y,comp,req_comp,ri);
                  local_5c = req_comp;
                  if (req_comp == 0) {
                    local_5c = *comp;
                  }
                  s_local = (stbi__context *)stbi__hdr_to_ldr(data,*x,*y,local_5c);
                }
              }
              else {
                s_local = (stbi__context *)stbi__pnm_load(s,x,y,comp,req_comp,ri);
              }
            }
            else {
              s_local = (stbi__context *)stbi__jpeg_load(s,x,y,comp,req_comp,ri);
            }
          }
          else {
            s_local = (stbi__context *)stbi__pic_load(s,x,y,comp,req_comp,ri);
          }
        }
        else {
          s_local = (stbi__context *)stbi__psd_load(s,x,y,comp,req_comp,ri,bpc);
        }
      }
      else {
        s_local = (stbi__context *)stbi__gif_load(s,x,y,comp,req_comp,ri);
      }
    }
    else {
      s_local = (stbi__context *)stbi__bmp_load(s,x,y,comp,req_comp,ri);
    }
  }
  else {
    s_local = (stbi__context *)stbi__png_load(s,x,y,comp,req_comp,ri);
  }
  return s_local;
}

Assistant:

static void *stbi__load_main(stbi__context *s, int *x, int *y, int *comp, int req_comp, stbi__result_info *ri, int bpc)
{
   memset(ri, 0, sizeof(*ri)); // make sure it's initialized if we add new fields
   ri->bits_per_channel = 8; // default is 8 so most paths don't have to be changed
   ri->channel_order = STBI_ORDER_RGB; // all current input & output are this, but this is here so we can add BGR order
   ri->num_channels = 0;

   // test the formats with a very explicit header first (at least a FOURCC
   // or distinctive magic number first)
   #ifndef STBI_NO_PNG
   if (stbi__png_test(s))  return stbi__png_load(s,x,y,comp,req_comp, ri);
   #endif
   #ifndef STBI_NO_BMP
   if (stbi__bmp_test(s))  return stbi__bmp_load(s,x,y,comp,req_comp, ri);
   #endif
   #ifndef STBI_NO_GIF
   if (stbi__gif_test(s))  return stbi__gif_load(s,x,y,comp,req_comp, ri);
   #endif
   #ifndef STBI_NO_PSD
   if (stbi__psd_test(s))  return stbi__psd_load(s,x,y,comp,req_comp, ri, bpc);
   #else
   STBI_NOTUSED(bpc);
   #endif
   #ifndef STBI_NO_PIC
   if (stbi__pic_test(s))  return stbi__pic_load(s,x,y,comp,req_comp, ri);
   #endif

   // then the formats that can end up attempting to load with just 1 or 2
   // bytes matching expectations; these are prone to false positives, so
   // try them later
   #ifndef STBI_NO_JPEG
   if (stbi__jpeg_test(s)) return stbi__jpeg_load(s,x,y,comp,req_comp, ri);
   #endif
   #ifndef STBI_NO_PNM
   if (stbi__pnm_test(s))  return stbi__pnm_load(s,x,y,comp,req_comp, ri);
   #endif

   #ifndef STBI_NO_HDR
   if (stbi__hdr_test(s)) {
      float *hdr = stbi__hdr_load(s, x,y,comp,req_comp, ri);
      return stbi__hdr_to_ldr(hdr, *x, *y, req_comp ? req_comp : *comp);
   }
   #endif

   #ifndef STBI_NO_TGA
   // test tga last because it's a crappy test!
   if (stbi__tga_test(s))
      return stbi__tga_load(s,x,y,comp,req_comp, ri);
   #endif

   return stbi__errpuc("unknown image type", "Image not of any known type, or corrupt");
}